

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O1

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileaveBytes_naive_matches_jmp_::run
          (Test_bitileave_ileaveBytes_naive_matches_jmp_ *this)

{
  string_view msg;
  SourceLocation loc;
  char *pcVar1;
  char *pcVar2;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint64_t bytes;
  long lVar5;
  ulong uVar6;
  uint64_t jmp;
  uint64_t naive;
  size_t in_stack_fffffffffffffee0;
  _Alloc_hider _Var7;
  unsigned_long uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  char *local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bytes = 0x3039;
  lVar5 = 0x4000;
  uVar6 = 0;
  do {
    bytes = bytes * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    pcVar1 = (char *)detail::ileaveBytes_jmp(bytes,uVar6 % 9);
    pcVar2 = (char *)detail::ileaveBytes_naive(bytes,uVar6 % 9);
    if (pcVar1 != pcVar2) {
      detail::stringify_impl<unsigned_long>(&local_90,(unsigned_long *)&stack0xfffffffffffffee8);
      std::operator+(&local_70,"Comparison failed: jmp == naive (with \"jmp\"=",&local_90);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
      _Var7._M_p = (pointer)*plVar3;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p == paVar4) {
        local_d8._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_d8._8_8_ = plVar3[3];
        _Var7._M_p = (pointer)&local_d8;
      }
      else {
        local_d8._M_allocated_capacity = paVar4->_M_allocated_capacity;
      }
      uVar8 = plVar3[1];
      *plVar3 = (long)paVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      detail::stringify_impl<unsigned_long>(&local_b0,(unsigned_long *)&stack0xffffffffffffff10);
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff18,&local_b0);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      *plVar3 = (long)(plVar3 + 2);
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      local_c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      pcStack_c0 = "run";
      local_b8 = 0xd4;
      msg._M_str = pcVar1;
      msg._M_len = in_stack_fffffffffffffee0;
      loc.function = _Var7._M_p;
      loc.file = pcVar2;
      loc.line = uVar8;
      assertFail(msg,loc);
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  return;
}

Assistant:

BITMANIP_TEST(bitileave, ileaveBytes_naive_matches_jmp)
{
    constexpr size_t iterations = 1024 * 16;

    fast_rng64 rng{12345};
    std::uniform_int_distribution<std::uint64_t> distr;

    for (size_t i = 0; i < iterations; ++i) {
        std::uint64_t bytesAsInt = distr(rng);

        std::uint64_t jmp = detail::ileaveBytes_jmp(bytesAsInt, i % 9);
        std::uint64_t naive = detail::ileaveBytes_naive(bytesAsInt, i % 9);
        BITMANIP_ASSERT_EQ(jmp, naive);
    }
}